

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float64_le_quiet_mips(float64 a,float64 b,float_status *status)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  float64 a_;
  float64 a__00;
  bool bVar4;
  
  a_ = float64_squash_input_denormal_mips(a,status);
  a__00 = float64_squash_input_denormal_mips(b,status);
  if (((~a_ & 0x7ff0000000000000) != 0 || (a_ & 0xfffffffffffff) == 0) &&
     ((a__00 & 0xfffffffffffff) == 0 || (~a__00 & 0x7ff0000000000000) != 0)) {
    if ((long)(a__00 ^ a_) < 0) {
      bVar4 = (long)a_ < 0;
      bVar1 = ((a__00 | a_) & 0x7fffffffffffffff) == 0;
    }
    else {
      bVar4 = a_ == a__00;
      bVar1 = (long)a_ < 0 != a_ < a__00;
    }
    bVar2 = bVar1 | bVar4;
    goto LAB_00698e43;
  }
  iVar3 = float64_is_signaling_nan_mips(a_,status);
  if (iVar3 == 0) {
    iVar3 = float64_is_signaling_nan_mips(a__00,status);
    if (iVar3 != 0) goto LAB_00698e27;
  }
  else {
LAB_00698e27:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  bVar2 = 0;
LAB_00698e43:
  return (int)bVar2;
}

Assistant:

int float64_le_quiet(float64 a, float64 b, float_status *status)
{
    flag aSign, bSign;
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat64Sign( a );
    bSign = extractFloat64Sign( b );
    av = float64_val(a);
    bv = float64_val(b);
    if ( aSign != bSign ) return aSign || ( (uint64_t) ( ( av | bv )<<1 ) == 0 );
    return ( av == bv ) || ( aSign ^ ( av < bv ) );

}